

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::AggregateMarking::GetAggregateMarkingString_abi_cxx11_
          (KString *__return_storage_ptr__,AggregateMarking *this)

{
  size_t sVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(this->m_sAggregateMarkingString);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,this->m_sAggregateMarkingString,
             this->m_sAggregateMarkingString + sVar1);
  return __return_storage_ptr__;
}

Assistant:

KString AggregateMarking::GetAggregateMarkingString() const
{
    return m_sAggregateMarkingString;
}